

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O0

cx_string<12UL>
mserialize::cx_strcat<7ul,3ul,1ul,1ul>
          (cx_string<7UL> *strings,cx_string<3UL> *strings_1,cx_string<1UL> *strings_2,
          cx_string<1UL> *strings_3)

{
  cx_string<1UL> *in_RCX;
  cx_string<1UL> *in_RDX;
  cx_string<3UL> *in_RSI;
  cx_string<7UL> *in_RDI;
  cx_string<12UL> cVar1;
  size_t s;
  size_t i;
  char *out;
  size_t size [5];
  char *data [5];
  char buffer [13];
  ulong local_b0;
  ulong local_a8;
  char *local_a0;
  size_t local_90 [5];
  char *local_68;
  data_ref local_60;
  data_ref local_58;
  data_ref local_50;
  data_ref local_48;
  char local_3d [13];
  cx_string<1UL> *local_30;
  cx_string<1UL> *local_28;
  cx_string<3UL> *local_20;
  cx_string<7UL> *local_18;
  cx_string<12UL> local_d;
  
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  memset(local_3d,0,0xd);
  local_68 = "";
  local_60 = cx_string<7UL>::data(local_18);
  local_58 = cx_string<3UL>::data(local_20);
  local_50 = cx_string<1UL>::data(local_28);
  local_48 = cx_string<1UL>::data(local_30);
  local_90[0] = cx_string<7UL>::size(local_18);
  local_90[1] = cx_string<3UL>::size(local_20);
  local_90[2] = cx_string<1UL>::size(local_28);
  local_90[3] = cx_string<1UL>::size(local_30);
  local_a0 = local_3d;
  for (local_a8 = 1; local_a8 < 5; local_a8 = local_a8 + 1) {
    for (local_b0 = 0; local_b0 < local_90[local_a8 - 1]; local_b0 = local_b0 + 1) {
      *local_a0 = (&local_68)[local_a8][local_b0];
      local_a0 = local_a0 + 1;
    }
  }
  cx_string<12UL>::cx_string(&local_d,local_3d);
  cVar1._data[5] = local_d._data[5];
  cVar1._data[6] = local_d._data[6];
  cVar1._data[7] = local_d._data[7];
  cVar1._data[0] = local_d._data[0];
  cVar1._data[1] = local_d._data[1];
  cVar1._data[2] = local_d._data[2];
  cVar1._data[3] = local_d._data[3];
  cVar1._data[4] = local_d._data[4];
  cVar1._data[8] = local_d._data[8];
  cVar1._data[9] = local_d._data[9];
  cVar1._data[10] = local_d._data[10];
  cVar1._data[0xb] = local_d._data[0xb];
  cVar1._data[0xc] = local_d._data[0xc];
  return (cx_string<12UL>)cVar1._data;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}